

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::RaceSuccessfulPromiseNode<void>::getNoError
          (RaceSuccessfulPromiseNode<void> *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> *this_00;
  Void local_1b9;
  ExceptionOr<kj::_::Void> local_1b8;
  ExceptionOrValue *local_18;
  ExceptionOrValue *output_local;
  RaceSuccessfulPromiseNode<void> *this_local;
  
  local_18 = output;
  output_local = (ExceptionOrValue *)this;
  ExceptionOr<kj::_::Void>::ExceptionOr(&local_1b8,&local_1b9);
  this_00 = ExceptionOrValue::as<kj::_::Void>(local_18);
  ExceptionOr<kj::_::Void>::operator=(this_00,&local_1b8);
  ExceptionOr<kj::_::Void>::~ExceptionOr(&local_1b8);
  return;
}

Assistant:

void getNoError(ExceptionOrValue &output) noexcept override {
    output.as<_::Void>() = _::Void();
  }